

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_table.c
# Opt level: O3

int lj_cf_table_foreachi(lua_State *L)

{
  anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 aVar1;
  TValue *pTVar2;
  MSize MVar3;
  cTValue *pcVar4;
  TValue *pTVar5;
  uint key;
  GCtab *t;
  
  pTVar2 = L->base;
  pTVar5 = L->top;
  if ((pTVar5 <= pTVar2) || ((pTVar2->field_2).it != 0xfffffff4)) {
    lj_err_argt(L,1,5);
  }
  if ((pTVar2 + 1 < pTVar5) && (*(int *)((long)pTVar2 + 0xc) == -9)) {
    t = (GCtab *)(ulong)(pTVar2->u32).lo;
    aVar1 = pTVar2[1].field_2.field_0;
    MVar3 = lj_tab_len(t);
    if (MVar3 != 0) {
      key = 1;
      do {
        (pTVar5->field_2).field_0 = aVar1;
        (pTVar5->field_2).it = 0xfffffff7;
        L->top[1].n = (double)(int)key;
        if (key < t->asize) {
          pcVar4 = (cTValue *)((ulong)(t->array).ptr32 + (long)(int)key * 8);
        }
        else {
          pcVar4 = lj_tab_getinth(t,key);
        }
        if (pcVar4 == (cTValue *)0x0) {
          *(undefined4 *)((long)L->top + 0x14) = 0xffffffff;
        }
        else {
          L->top[2] = *pcVar4;
        }
        pTVar2 = L->top;
        L->top = pTVar2 + 3;
        lj_vm_call(L,pTVar2 + 1,2);
        if (*(int *)((long)L->top + -4) != -1) {
          return 1;
        }
        pTVar5 = L->top + -1;
        L->top = pTVar5;
        key = key + 1;
      } while (key <= MVar3);
    }
    return 0;
  }
  lj_err_argt(L,2,6);
}

Assistant:

LJLIB_CF(table_foreachi)
{
  GCtab *t = lj_lib_checktab(L, 1);
  GCfunc *func = lj_lib_checkfunc(L, 2);
  MSize i, n = lj_tab_len(t);
  for (i = 1; i <= n; i++) {
    cTValue *val;
    setfuncV(L, L->top, func);
    setintV(L->top+1, i);
    val = lj_tab_getint(t, (int32_t)i);
    if (val) { copyTV(L, L->top+2, val); } else { setnilV(L->top+2); }
    L->top += 3;
    lua_call(L, 2, 1);
    if (!tvisnil(L->top-1))
      return 1;
    L->top--;
  }
  return 0;
}